

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int isDistinctRedundant(Parse *pParse,SrcList *pTabList,WhereClause *pWC,ExprList *pDistinct)

{
  int iVar1;
  Expr *pEVar2;
  WhereTerm *pWVar3;
  int *in_RCX;
  ExprList *in_RDX;
  Parse *in_RSI;
  WhereClause *in_RDI;
  Expr *p;
  int iBase;
  int i;
  Index *pIdx;
  Table *pTab;
  uint local_3c;
  Index *pIdx_00;
  Index *pIdx_01;
  
  if (*(int *)&in_RSI->db == 1) {
    iVar1._0_1_ = in_RSI->disableLookaside;
    iVar1._1_1_ = in_RSI->prepFlags;
    iVar1._2_1_ = in_RSI->withinRJSubrtn;
    iVar1._3_1_ = in_RSI->bHasWith;
    pIdx_01 = *(Index **)&in_RSI->rc;
    for (local_3c = 0; (int)local_3c < *in_RCX; local_3c = local_3c + 1) {
      pEVar2 = sqlite3ExprSkipCollateAndLikely(*(Expr **)(in_RCX + (long)(int)local_3c * 6 + 2));
      if ((pEVar2 != (Expr *)0x0) &&
         ((((pEVar2->op == 0xa8 || (pEVar2->op == 0xaa)) && (pEVar2->iTable == iVar1)) &&
          (pEVar2->iColumn < 0)))) {
        return 1;
      }
    }
    for (pIdx_00 = (Index *)pIdx_01->aiRowLogEst; pIdx_00 != (Index *)0x0; pIdx_00 = pIdx_00->pNext)
    {
      if ((pIdx_00->onError != '\0') && (pIdx_00->pPartIdxWhere == (Expr *)0x0)) {
        local_3c = 0;
        while (((int)local_3c < (int)(uint)pIdx_00->nKeyCol &&
               ((pWVar3 = sqlite3WhereFindTerm
                                    (in_RDI,(int)((ulong)in_RSI >> 0x20),(int)in_RSI,(Bitmask)in_RDX
                                     ,(u32)((ulong)in_RCX >> 0x20),pIdx_01),
                pWVar3 != (WhereTerm *)0x0 ||
                ((iVar1 = findIndexCol(in_RSI,in_RDX,(int)((ulong)in_RCX >> 0x20),pIdx_01,
                                       (int)((ulong)pIdx_00 >> 0x20)), -1 < iVar1 &&
                 (iVar1 = indexColumnNotNull(pIdx_00,local_3c), iVar1 != 0))))))) {
          local_3c = local_3c + 1;
        }
        if (local_3c == pIdx_00->nKeyCol) {
          return 1;
        }
      }
    }
  }
  return 0;
}

Assistant:

static int isDistinctRedundant(
  Parse *pParse,            /* Parsing context */
  SrcList *pTabList,        /* The FROM clause */
  WhereClause *pWC,         /* The WHERE clause */
  ExprList *pDistinct       /* The result set that needs to be DISTINCT */
){
  Table *pTab;
  Index *pIdx;
  int i;
  int iBase;

  /* If there is more than one table or sub-select in the FROM clause of
  ** this query, then it will not be possible to show that the DISTINCT
  ** clause is redundant. */
  if( pTabList->nSrc!=1 ) return 0;
  iBase = pTabList->a[0].iCursor;
  pTab = pTabList->a[0].pSTab;

  /* If any of the expressions is an IPK column on table iBase, then return
  ** true. Note: The (p->iTable==iBase) part of this test may be false if the
  ** current SELECT is a correlated sub-query.
  */
  for(i=0; i<pDistinct->nExpr; i++){
    Expr *p = sqlite3ExprSkipCollateAndLikely(pDistinct->a[i].pExpr);
    if( NEVER(p==0) ) continue;
    if( p->op!=TK_COLUMN && p->op!=TK_AGG_COLUMN ) continue;
    if( p->iTable==iBase && p->iColumn<0 ) return 1;
  }

  /* Loop through all indices on the table, checking each to see if it makes
  ** the DISTINCT qualifier redundant. It does so if:
  **
  **   1. The index is itself UNIQUE, and
  **
  **   2. All of the columns in the index are either part of the pDistinct
  **      list, or else the WHERE clause contains a term of the form "col=X",
  **      where X is a constant value. The collation sequences of the
  **      comparison and select-list expressions must match those of the index.
  **
  **   3. All of those index columns for which the WHERE clause does not
  **      contain a "col=X" term are subject to a NOT NULL constraint.
  */
  for(pIdx=pTab->pIndex; pIdx; pIdx=pIdx->pNext){
    if( !IsUniqueIndex(pIdx) ) continue;
    if( pIdx->pPartIdxWhere ) continue;
    for(i=0; i<pIdx->nKeyCol; i++){
      if( 0==sqlite3WhereFindTerm(pWC, iBase, i, ~(Bitmask)0, WO_EQ, pIdx) ){
        if( findIndexCol(pParse, pDistinct, iBase, pIdx, i)<0 ) break;
        if( indexColumnNotNull(pIdx, i)==0 ) break;
      }
    }
    if( i==pIdx->nKeyCol ){
      /* This index implies that the DISTINCT qualifier is redundant. */
      return 1;
    }
  }

  return 0;
}